

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * qcc_arena_append_array(qcc_arena *arena,void *data,size_t size)

{
  size_t sVar1;
  void *item;
  size_t size_local;
  void *data_local;
  qcc_arena *arena_local;
  
  sVar1 = qcc_arena_memory_available(arena);
  if (sVar1 < size) {
    arena_local = (qcc_arena *)0x0;
  }
  else {
    arena_local = (qcc_arena *)arena->array_end;
    if (data != (void *)0x0) {
      memcpy(arena_local,data,size);
    }
    arena->array_end = arena->array_end + size;
  }
  return arena_local;
}

Assistant:

void *qcc_arena_append_array(struct qcc_arena *arena, const void *data,
                             size_t size)
{
    if (size > qcc_arena_memory_available(arena)) return 0;

    void *item = arena->array_end;
    if (data) memcpy(item, data, size);
    arena->array_end += size;
    return item;
}